

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O1

clockval_t * __thiscall
tchecker::clockval_allocate_and_construct
          (tchecker *this,unsigned_short size,clock_rational_value_t value)

{
  no_storage_array_t<boost::rational<long>_> nVar1;
  clockval_t *pcVar2;
  no_storage_array_t<boost::rational<long>_> *pnVar3;
  undefined6 in_register_00000032;
  ulong uVar4;
  
  nVar1._2_6_ = in_register_00000032;
  nVar1._0_2_ = size;
  uVar4 = (ulong)(uint)((int)this << 4);
  pcVar2 = (clockval_t *)operator_new__(uVar4 + 0x10);
  (pcVar2->super_clock_value_array_t).super_clockval_base_t.super_array_capacity_t<unsigned_short>.
  _capacity = (unsigned_short)this;
  if ((int)this != 0) {
    pnVar3 = &(pcVar2->super_clock_value_array_t)._fam;
    do {
      *pnVar3 = nVar1;
      pnVar3[1] = (no_storage_array_t<boost::rational<long>_>)value.num;
      pnVar3 = pnVar3 + 2;
    } while (pnVar3 != (no_storage_array_t<boost::rational<long>_> *)
                       (&(pcVar2->super_clock_value_array_t)._fam.field_0x0 + uVar4));
  }
  return pcVar2;
}

Assistant:

tchecker::clockval_t * clockval_allocate_and_construct(unsigned short size, tchecker::clock_rational_value_t value)
{
  char * ptr = new char[tchecker::allocation_size_t<tchecker::clockval_t>::alloc_size(size)];
  tchecker::clockval_t::construct(ptr, size, value);
  return reinterpret_cast<tchecker::clockval_t *>(ptr);
}